

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

bool __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>_>
::IfConsiderConversion
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>_>
           *this)

{
  ConstraintAcceptanceLevel CVar1;
  ExpressionAcceptanceLevel EVar2;
  bool bVar3;
  
  CVar1 = BasicConstraintKeeper::GetChosenAcceptanceLevel(&this->super_BasicConstraintKeeper);
  if (CVar1 == NotAccepted) {
    bVar3 = true;
  }
  else {
    if (((this->cvt_->
         super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
         ).
         super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
         .options_.accExpr_ == 1) &&
       (EVar2 = BasicConstraintKeeper::GetChosenAcceptanceLevelEXPR
                          (&this->super_BasicConstraintKeeper), EVar2 != NotAccepted)) {
      return false;
    }
    bVar3 = (this->cvt_->
            super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ).
            super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .options_.accAll_ != 2;
  }
  return bVar3;
}

Assistant:

bool IfConsiderConversion() const {
    return
        (ConstraintAcceptanceLevel::NotAccepted == GetChosenAcceptanceLevel()
         || (ConstraintAcceptanceLevel::NotAccepted == GetModelAPIAcceptance()
             && (!GetConverter().IfWantNLOutput()
                 || ExpressionAcceptanceLevel::NotAccepted
                        == GetChosenAcceptanceLevelEXPR())
                && 2 != AccLevelCommon()));             // Not when acc:_all=2
  }